

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O3

void Ndr_ObjWriteRange(Ndr_Data_t *p,int Obj,FILE *pFile,int fSkipBin)

{
  byte bVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  uint *puVar9;
  
  iVar7 = Obj + 1;
  puVar2 = p->pBody;
  if (iVar7 < (int)(puVar2[Obj] + Obj)) {
    puVar8 = (uint *)0x0;
    puVar9 = (uint *)0x0;
    uVar4 = 0;
    do {
      bVar1 = p->pHead[iVar7];
      if (bVar1 == 8) {
        uVar4 = uVar4 + 1;
        uVar6 = 1;
        puVar9 = puVar8;
        if (puVar8 == (uint *)0x0) {
          puVar8 = puVar2 + iVar7;
          puVar9 = puVar8;
        }
      }
      else {
        if (bVar1 == 0) {
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
        if (puVar9 != (uint *)0x0) break;
        if (bVar1 < 4) {
          uVar6 = puVar2[iVar7];
        }
        else {
          uVar6 = 1;
        }
        puVar9 = (uint *)0x0;
      }
      iVar7 = iVar7 + uVar6;
    } while (iVar7 < (int)(puVar2[Obj] + Obj));
  }
  else {
    puVar8 = (uint *)0x0;
    uVar4 = 0;
  }
  if (fSkipBin != 0 && uVar4 < 2) {
    return;
  }
  if (uVar4 == 3 && fSkipBin != 0) {
    fwrite("signed ",7,1,(FILE *)pFile);
    return;
  }
  if (uVar4 == 0) {
    if (fSkipBin == 0) {
      uVar3 = 0;
LAB_00384971:
      fprintf((FILE *)pFile,"[%d]",uVar3);
      return;
    }
    uVar3 = 0;
    uVar5 = 0;
  }
  else if (uVar4 == 1) {
    uVar3 = (ulong)*puVar8;
    uVar5 = uVar3;
    if (fSkipBin == 0) goto LAB_00384971;
  }
  else {
    uVar3 = (ulong)puVar8[1];
    uVar5 = (ulong)*puVar8;
  }
  fprintf((FILE *)pFile,"[%d:%d]",uVar5,uVar3);
  return;
}

Assistant:

static inline void Ndr_ObjWriteRange( Ndr_Data_t * p, int Obj, FILE * pFile, int fSkipBin )
{
    int * pArray, nArray = Ndr_ObjReadArray( p, Obj, NDR_RANGE, &pArray );
    if ( (nArray == 0 || nArray == 1) && fSkipBin )
        return;
    if ( nArray == 3 && fSkipBin )
        fprintf( pFile, "signed " ); 
    else if ( nArray == 1 )
    {
        if ( fSkipBin )
            fprintf( pFile, "[%d:%d]", pArray[0], pArray[0] );
        else
            fprintf( pFile, "[%d]", pArray[0] );
    }
    else if ( nArray == 0 )
    {
        if ( fSkipBin )
            fprintf( pFile, "[%d:%d]", 0, 0 );
        else
            fprintf( pFile, "[%d]", 0 );
    }
    else
        fprintf( pFile, "[%d:%d]", pArray[0], pArray[1] );
}